

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args,PyObject *kwargs)

{
  PyObject *pPVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  PyObject *pPVar7;
  handle *phVar8;
  PyTypeObject *pPVar9;
  PyObject **ppPVar10;
  reference paVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  undefined8 uVar18;
  type_info *ptVar19;
  PyTypeObject *local_388;
  size_t local_380;
  type_info *tinfo;
  PyObject *inst;
  string local_360 [8];
  string msg_1;
  tuple_accessor local_340;
  handle local_320;
  PyObject *local_318;
  str local_310;
  str local_308 [4];
  ulong local_2e8;
  size_t ti;
  tuple local_2d8;
  tuple args__1;
  size_t ret;
  size_t next;
  size_t end;
  size_t start;
  string local_2a8 [8];
  string sig;
  __cxx11 local_280 [7];
  bool wrote_sig;
  string local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  undefined8 *local_220;
  function_record *it2_1;
  int ctr;
  allocator local_1e9;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [8];
  string msg;
  handle local_168 [2];
  error_already_set *e;
  _func_void_exception_ptr **translator;
  iterator __end3;
  iterator __begin3;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *__range3;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *registered_exception_translators;
  exception_ptr last_exception;
  reference_cast_error *anon_var_0;
  handle local_f8;
  PyObject *local_f0;
  handle local_e8;
  handle local_e0;
  handle local_d8;
  handle value;
  int index;
  argument_record *it2;
  iterator __end4;
  iterator __begin4;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range4;
  int arg_ctr;
  handle item;
  size_t i;
  PyObject *local_88;
  size_t nargs_;
  size_t kwargs_consumed;
  handle local_68;
  handle local_60;
  tuple args_;
  handle result;
  handle parent;
  size_t nkwargs;
  size_t nargs;
  function_record *it;
  function_record *overloads;
  PyObject *kwargs_local;
  PyObject *args_local;
  PyObject *self_local;
  
  puVar6 = (undefined8 *)PyCapsule_GetPointer(self,0);
  iVar5 = PyType_HasFeature(args->ob_type,0x4000000);
  if (iVar5 == 0) {
    __assert_fail("PyTuple_Check(args)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                  ,0x184,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  pPVar1 = (PyObject *)args[1].ob_refcnt;
  if (kwargs == (PyObject *)0x0) {
    local_380 = 0;
  }
  else {
    local_380 = PyDict_Size(kwargs);
  }
  if (pPVar1 == (PyObject *)0x0) {
    local_388 = (PyTypeObject *)0x0;
  }
  else {
    iVar5 = PyType_HasFeature(args->ob_type,0x4000000);
    if (iVar5 == 0) {
      __assert_fail("PyTuple_Check(args)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                    ,0x187,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    local_388 = args[1].ob_type;
  }
  handle::handle(&result,(PyObject *)local_388);
  handle::handle((handle *)&args_,(PyObject *)0x1);
  for (nargs = (size_t)puVar6; nargs != 0; nargs = *(size_t *)(nargs + 0x78)) {
    handle::handle(&local_68,args);
    reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_60,local_68);
    nargs_ = 0;
    local_88 = pPVar1;
    pPVar7 = (PyObject *)
             std::
             vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     *)(nargs + 0x18));
    if (pPVar1 < pPVar7) {
      local_88 = (PyObject *)
                 std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         *)(nargs + 0x18));
      tuple::tuple((tuple *)&i,(size_t)local_88);
      tuple::operator=((tuple *)&local_60,(tuple *)&i);
      tuple::~tuple((tuple *)&i);
      for (item.m_ptr = (PyObject *)0x0; item.m_ptr < pPVar1;
          item.m_ptr = (PyObject *)((long)&(item.m_ptr)->ob_refcnt + 1)) {
        iVar5 = PyType_HasFeature(args->ob_type,0x4000000);
        if (iVar5 == 0) {
          __assert_fail("PyTuple_Check(args)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                        ,0x19a,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        handle::handle((handle *)&stack0xffffffffffffff60,
                       (PyObject *)(&args[1].ob_type)[(long)item.m_ptr]);
        phVar8 = handle::inc_ref((handle *)&stack0xffffffffffffff60);
        pPVar9 = (PyTypeObject *)handle::ptr(phVar8);
        ppPVar10 = handle::ptr(&local_60);
        iVar5 = PyType_HasFeature((*ppPVar10)->ob_type,0x4000000);
        if (iVar5 == 0) {
          __assert_fail("PyTuple_Check(args_.ptr())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                        ,0x19b,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        ppPVar10 = handle::ptr(&local_60);
        (&(*ppPVar10)[1].ob_type)[(long)item.m_ptr] = pPVar9;
      }
      __range4._4_4_ = 0;
      __end4 = std::
               vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ::begin((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                        *)(nargs + 0x18));
      it2 = (argument_record *)
            std::
            vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ::end((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   *)(nargs + 0x18));
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                         *)&it2), bVar4) {
        paVar11 = __gnu_cxx::
                  __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                  ::operator*(&__end4);
        value.m_ptr._4_4_ = __range4._4_4_;
        ppPVar10 = handle::ptr(&local_60);
        iVar5 = PyType_HasFeature((*ppPVar10)->ob_type,0x4000000);
        if (iVar5 == 0) {
          __assert_fail("PyTuple_Check(args_.ptr())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                        ,0x1a1,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        ppPVar10 = handle::ptr(&local_60);
        if ((&(*ppPVar10)[1].ob_type)[value.m_ptr._4_4_] == (PyTypeObject *)0x0) {
          handle::handle(&local_d8);
          if (kwargs != (PyObject *)0x0) {
            pPVar7 = (PyObject *)PyDict_GetItemString(kwargs,*(undefined8 *)paVar11);
            handle::handle(&local_e0,pPVar7);
            local_d8.m_ptr = local_e0.m_ptr;
          }
          bVar4 = handle::operator_cast_to_bool(&local_d8);
          if (bVar4) {
            nargs_ = nargs_ + 1;
          }
          else {
            bVar4 = handle::operator_cast_to_bool((handle *)(paVar11 + 0x10));
            if (bVar4) {
              local_d8.m_ptr = *(PyObject **)(paVar11 + 0x10);
            }
          }
          bVar4 = handle::operator_cast_to_bool(&local_d8);
          if (!bVar4) {
            nargs_ = 0xffffffffffffffff;
            break;
          }
          phVar8 = handle::inc_ref(&local_d8);
          pPVar9 = (PyTypeObject *)handle::ptr(phVar8);
          ppPVar10 = handle::ptr(&local_60);
          iVar5 = PyType_HasFeature((*ppPVar10)->ob_type,0x4000000);
          if (iVar5 == 0) {
            __assert_fail("PyTuple_Check(args_.ptr())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                          ,0x1ae,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          ppPVar10 = handle::ptr(&local_60);
          (&(*ppPVar10)[1].ob_type)[value.m_ptr._4_4_] = pPVar9;
        }
        __gnu_cxx::
        __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
        ::operator++(&__end4);
        __range4._4_4_ = __range4._4_4_ + 1;
      }
    }
    if (((nargs_ == local_380) || ((*(byte *)(nargs + 0x59) >> 4 & 1) != 0)) &&
       ((local_88 == (PyObject *)(ulong)*(ushort *)(nargs + 0x5a) ||
        ((*(byte *)(nargs + 0x59) >> 3 & 1) != 0)))) {
      pcVar2 = *(code **)(nargs + 0x30);
      local_f0 = local_60.m_ptr;
      handle::handle(&local_f8,kwargs);
      local_e8.m_ptr = (PyObject *)(*pcVar2)(nargs,local_f0,local_f8.m_ptr,result.m_ptr);
      args_.super_object.super_handle.m_ptr = (object)(object)local_e8.m_ptr;
    }
    ppPVar10 = handle::ptr((handle *)&args_);
    pPVar7 = *ppPVar10;
    tuple::~tuple((tuple *)&local_60);
    if (pPVar7 != (PyObject *)0x1) break;
  }
  ppPVar10 = handle::ptr((handle *)&args_);
  if (*ppPVar10 == (PyObject *)0x1) {
    if ((*(byte *)((long)puVar6 + 0x59) >> 2 & 1) == 0) {
      pcVar12 = (char *)*puVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,pcVar12,&local_1e9);
      std::operator+(local_1c8,(char *)local_1e8);
      pcVar12 = "function";
      if ((*(byte *)((long)puVar6 + 0x59) & 1) != 0) {
        pcVar12 = "constructor";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&ctr,pcVar12,(allocator *)((long)&it2_1 + 7));
      std::operator+(local_1a8,local_1c8);
      std::operator+(local_188,(char *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string((string *)&ctr);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it2_1 + 7));
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      it2_1._0_4_ = 0;
      for (local_220 = puVar6; local_220 != (undefined8 *)0x0;
          local_220 = (undefined8 *)local_220[0xf]) {
        it2_1._0_4_ = (int)it2_1 + 1;
        std::__cxx11::to_string(local_280,(int)it2_1);
        std::operator+((char *)local_260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"    ");
        std::operator+(local_240,(char *)local_260);
        std::__cxx11::string::operator+=((string *)local_188,(string *)local_240);
        std::__cxx11::string::~string((string *)local_240);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string((string *)local_280);
        bVar4 = false;
        if ((*(byte *)((long)puVar6 + 0x59) & 1) != 0) {
          pcVar12 = (char *)local_220[2];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2a8,pcVar12,(allocator *)((long)&start + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
          lVar13 = std::__cxx11::string::find((char)local_2a8,0x28);
          uVar14 = lVar13 + 7;
          uVar15 = std::__cxx11::string::size();
          if (uVar14 < uVar15) {
            next = std::__cxx11::string::find((char *)local_2a8,0x124ce9);
            ret = next + 2;
            args__1.super_object.super_handle.m_ptr =
                 (object)std::__cxx11::string::rfind((char *)local_2a8,0x124cec);
            uVar15 = std::__cxx11::string::size();
            if (uVar15 <= next) {
              ret = std::__cxx11::string::find((char)local_2a8,0x29);
              next = ret;
            }
            if ((uVar14 < next) && (uVar15 = std::__cxx11::string::size(), ret < uVar15)) {
              std::__cxx11::string::append((string *)local_188,(ulong)local_2a8,uVar14);
              std::__cxx11::string::operator+=((string *)local_188,'(');
              std::__cxx11::string::append((string *)local_188,(ulong)local_2a8,ret);
              bVar4 = true;
            }
          }
          std::__cxx11::string::~string(local_2a8);
        }
        if (!bVar4) {
          std::__cxx11::string::operator+=((string *)local_188,(char *)local_220[2]);
        }
        std::__cxx11::string::operator+=((string *)local_188,"\n");
      }
      std::__cxx11::string::operator+=((string *)local_188,"\nInvoked with: ");
      handle::handle((handle *)&ti,args);
      reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_2d8,(handle)ti);
      for (local_2e8 = (ulong)(int)(uint)((*(byte *)((long)puVar6 + 0x59) & 1) != 0);
          uVar14 = local_2e8, sVar16 = tuple::size(&local_2d8), uVar3 = _PyExc_TypeError,
          uVar14 < sVar16; local_2e8 = local_2e8 + 1) {
        tuple::operator[](&local_340,&local_2d8,local_2e8);
        detail::accessor::operator_cast_to_object((accessor *)&local_320);
        local_318 = local_320.m_ptr;
        repr((pybind11 *)&local_310,local_320);
        str::operator_cast_to_string(local_308);
        std::__cxx11::string::operator+=((string *)local_188,(string *)local_308);
        std::__cxx11::string::~string((string *)local_308);
        str::~str(&local_310);
        object::~object((object *)&local_320);
        detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor(&local_340);
        sVar16 = local_2e8 + 1;
        sVar17 = tuple::size(&local_2d8);
        if (sVar16 != sVar17) {
          std::__cxx11::string::operator+=((string *)local_188,", ");
        }
      }
      uVar18 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar3,uVar18);
      self_local = (PyObject *)0x0;
      tuple::~tuple(&local_2d8);
      std::__cxx11::string::~string((string *)local_188);
    }
    else {
      handle::handle(local_168,(PyObject *)&_Py_NotImplementedStruct);
      phVar8 = handle::inc_ref(local_168);
      self_local = handle::ptr(phVar8);
    }
  }
  else {
    bVar4 = handle::operator_cast_to_bool((handle *)&args_);
    if (bVar4) {
      if ((*(byte *)((long)puVar6 + 0x59) & 1) != 0) {
        iVar5 = PyType_HasFeature(args->ob_type,0x4000000);
        if (iVar5 == 0) {
          __assert_fail("PyTuple_Check(args)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                        ,0x215,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        pPVar9 = args[1].ob_type;
        ptVar19 = detail::get_type_info((pPVar9->ob_base).ob_base.ob_type);
        (*ptVar19->init_holder)((PyObject *)pPVar9,(void *)0x0);
      }
      ppPVar10 = handle::ptr((handle *)&args_);
      self_local = *ppPVar10;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_360,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 (allocator *)((long)&inst + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&inst + 7));
      std::__cxx11::string::operator+=(local_360,*(char **)(nargs + 0x10));
      uVar3 = _PyExc_TypeError;
      uVar18 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar3,uVar18);
      self_local = (PyObject *)0x0;
      std::__cxx11::string::~string(local_360);
    }
  }
  return self_local;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args, PyObject *kwargs) {
        /* Iterator over the list of potentially admissible overloads */
        detail::function_record *overloads = (detail::function_record *) PyCapsule_GetPointer(self, nullptr),
                                *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        size_t nargs = (size_t) PyTuple_GET_SIZE(args),
               nkwargs = kwargs ? (size_t) PyDict_Size(kwargs) : 0;

        handle parent = nargs > 0 ? PyTuple_GET_ITEM(args, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;
        try {
            for (; it != nullptr; it = it->next) {
                auto args_ = reinterpret_borrow<tuple>(args);
                size_t kwargs_consumed = 0;

                /* For each overload:
                   1. If the required list of arguments is longer than the
                      actually provided amount, create a copy of the argument
                      list and fill in any available keyword/default arguments.
                   2. Ensure that all keyword arguments were "consumed"
                   3. Call the function call dispatcher (function_record::impl)
                 */
                size_t nargs_ = nargs;
                if (nargs < it->args.size()) {
                    nargs_ = it->args.size();
                    args_ = tuple(nargs_);
                    for (size_t i = 0; i < nargs; ++i) {
                        handle item = PyTuple_GET_ITEM(args, i);
                        PyTuple_SET_ITEM(args_.ptr(), i, item.inc_ref().ptr());
                    }

                    int arg_ctr = 0;
                    for (auto const &it2 : it->args) {
                        int index = arg_ctr++;
                        if (PyTuple_GET_ITEM(args_.ptr(), index))
                            continue;

                        handle value;
                        if (kwargs)
                            value = PyDict_GetItemString(kwargs, it2.name);

                        if (value)
                            kwargs_consumed++;
                        else if (it2.value)
                            value = it2.value;

                        if (value) {
                            PyTuple_SET_ITEM(args_.ptr(), index, value.inc_ref().ptr());
                        } else {
                            kwargs_consumed = (size_t) -1; /* definite failure */
                            break;
                        }
                    }
                }

                try {
                    if ((kwargs_consumed == nkwargs || it->has_kwargs) &&
                        (nargs_ == it->nargs || it->has_args))
                        result = it->impl(it, args_, kwargs, parent);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = pybind11::detail::get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (detail::function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += pybind11::repr(args_[ti]);
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                PyObject *inst = PyTuple_GET_ITEM(args, 0);
                auto tinfo = detail::get_type_info(Py_TYPE(inst));
                tinfo->init_holder(inst, nullptr);
            }
            return result.ptr();
        }
    }